

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,int field_number,_func_bool_int *is_valid,
               CodedOutputStream *unknown_fields_stream,RepeatedField<int> *values)

{
  bool bVar1;
  int iVar2;
  uint32 tag;
  int value;
  uint32 length;
  uint32 local_3c;
  Limit local_38;
  uint32 local_34;
  
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_34);
  if (bVar1) {
    local_38 = io::CodedInputStream::PushLimit(input,local_34);
    while( true ) {
      iVar2 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar2 < 1) break;
      bVar1 = ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (input,(int *)&local_3c);
      if (!bVar1) goto LAB_002d22cc;
      if (is_valid == (_func_bool_int *)0x0) {
LAB_002d22a7:
        RepeatedField<int>::Add(values,(int *)&local_3c);
      }
      else {
        bVar1 = (*is_valid)(local_3c);
        if (bVar1) goto LAB_002d22a7;
        io::CodedOutputStream::WriteVarint32(unknown_fields_stream,field_number << 3);
        io::CodedOutputStream::WriteVarint32(unknown_fields_stream,local_3c);
      }
    }
    io::CodedInputStream::PopLimit(input,local_38);
    bVar1 = true;
  }
  else {
LAB_002d22cc:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool WireFormatLite::ReadPackedEnumPreserveUnknowns(
    io::CodedInputStream* input,
    int field_number,
    bool (*is_valid)(int),
    io::CodedOutputStream* unknown_fields_stream,
    RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!google::protobuf::internal::WireFormatLite::ReadPrimitive<
        int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    } else {
      uint32 tag = WireFormatLite::MakeTag(field_number,
                                           WireFormatLite::WIRETYPE_VARINT);
      unknown_fields_stream->WriteVarint32(tag);
      unknown_fields_stream->WriteVarint32(value);
    }
  }
  input->PopLimit(limit);
  return true;
}